

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O0

void __thiscall HuffmanArchiver::unzip(HuffmanArchiver *this,istream *cin,ostream *cout)

{
  _Bit_iterator __last;
  _Bit_iterator __first;
  char cVar1;
  int iVar2;
  int iVar3;
  streamoff sVar4;
  uint uVar5;
  char *in_RDX;
  istream *in_RSI;
  long *in_RDI;
  iterator iVar6;
  size_t i;
  pair<bool,_char> node;
  bool bit;
  int j;
  size_t i_1;
  char ch;
  size_t size;
  int full_code_size;
  BitReader in;
  vector<bool,_std::allocator<bool>_> code;
  HuffTree tree;
  BitReader *in_stack_fffffffffffffe30;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe38;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe40;
  undefined2 in_stack_fffffffffffffe48;
  pair<bool,_char> in_stack_fffffffffffffe4a;
  int in_stack_fffffffffffffe4c;
  BitReader *in_stack_fffffffffffffe50;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  char in_stack_fffffffffffffe67;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe90;
  pair<bool,_char> local_15a;
  ulong local_158;
  pair<bool,_char> local_14b;
  HuffTree *in_stack_fffffffffffffeb8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffee8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffef0;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff10;
  char in_stack_ffffffffffffff1f;
  HuffTree *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff3c;
  int local_8c;
  ulong local_88;
  BitReader local_60;
  vector<bool,_std::allocator<bool>_> local_50;
  char *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  HuffTree::HuffTree((HuffTree *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1258f6);
  BitReader::BitReader(&local_60,local_10);
  iVar2 = BitReader::read_buf(in_stack_fffffffffffffe50,
                              CONCAT44(in_stack_fffffffffffffe4c,
                                       CONCAT22(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48)
                                      ));
  in_RDI[1] = (long)iVar2;
  iVar2 = BitReader::read_buf(in_stack_fffffffffffffe50,
                              CONCAT44(in_stack_fffffffffffffe4c,
                                       CONCAT22(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48)
                                      ));
  iVar3 = BitReader::read_buf(in_stack_fffffffffffffe50,
                              CONCAT44(in_stack_fffffffffffffe4c,
                                       CONCAT22(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48)
                                      ));
  for (local_88 = 0; local_88 < (ulong)(long)iVar3; local_88 = local_88 + 1) {
    std::vector<bool,_std::allocator<bool>_>::clear
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe50);
    cVar1 = BitReader::read_char(in_stack_fffffffffffffe30);
    for (local_8c = 0; local_8c < iVar2; local_8c = local_8c + 1) {
      BitReader::read_buf(in_stack_fffffffffffffe50,
                          CONCAT44(in_stack_fffffffffffffe4c,
                                   CONCAT22(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48)));
      std::vector<bool,_std::allocator<bool>_>::push_back
                (in_stack_fffffffffffffe90,SUB81((ulong)in_RDI >> 0x38,0));
    }
    std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x125a59)
    ;
    iVar6 = std::vector<bool,_std::allocator<bool>_>::end(&local_50);
    uVar5 = iVar6.super__Bit_iterator_base._M_offset;
    __first.super__Bit_iterator_base._8_7_ = in_stack_fffffffffffffe60;
    __first.super__Bit_iterator_base._M_p = (_Bit_type *)in_stack_fffffffffffffe58;
    __first.super__Bit_iterator_base._15_1_ = in_stack_fffffffffffffe67;
    __last.super__Bit_iterator_base._M_p._2_2_ = in_stack_fffffffffffffe4a;
    __last.super__Bit_iterator_base._M_p._0_2_ = in_stack_fffffffffffffe48;
    __last.super__Bit_iterator_base._M_p._4_4_ = in_stack_fffffffffffffe4c;
    __last.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffffe50;
    std::reverse<std::_Bit_iterator>(__first,__last);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    decode_full_code((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_ffffffffffffff3c,uVar5));
    in_stack_fffffffffffffe58 = &local_50;
    in_stack_fffffffffffffe50 = (BitReader *)&stack0xffffffffffffff08;
    std::vector<bool,_std::allocator<bool>_>::operator=
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x125b39);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x125b46);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    HuffTree::add_code(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f,in_stack_ffffffffffffff10
                      );
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x125b90);
    in_stack_fffffffffffffe67 = cVar1;
  }
  in_RDI[2] = (long)iVar3 * (long)(iVar2 + 8) + 0x70;
  in_RDI[2] = (ulong)in_RDI[2] >> 3;
  std::pair<bool,_char>::pair<bool,_char,_true>(&local_14b);
  HuffTree::back_to_root((HuffTree *)in_stack_fffffffffffffe30);
  local_158 = 0;
  while (local_158 < (ulong)in_RDI[1]) {
    in_stack_fffffffffffffe4c =
         BitReader::read_buf(in_stack_fffffffffffffe50,
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT22(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48))
                            );
    in_stack_fffffffffffffe4a =
         HuffTree::walk(in_stack_fffffffffffffeb8,in_stack_fffffffffffffe4c != 0);
    local_15a = in_stack_fffffffffffffe4a;
    std::pair<bool,_char>::operator=(&local_14b,&local_15a);
    if ((local_14b.first & 1U) != 0) {
      std::ostream::write(local_18,(long)&local_14b.second);
      HuffTree::back_to_root((HuffTree *)in_stack_fffffffffffffe30);
      local_158 = local_158 + 1;
    }
  }
  std::istream::tellg();
  sVar4 = std::fpos::operator_cast_to_long((fpos *)&stack0xfffffffffffffe90);
  *in_RDI = sVar4 - in_RDI[2];
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x125d6f)
  ;
  HuffTree::~HuffTree((HuffTree *)0x125d7c);
  return;
}

Assistant:

void HuffmanArchiver::unzip(std::istream &cin, std::ostream &cout) {
    HuffTree tree;
    std::vector<bool> code;

    BitReader in(cin);

    num_of_symbols_out = static_cast<std::size_t>(in.read_buf(BITS_IN_SIZE_T));
    int full_code_size = in.read_buf(BITS_IN_INT);
    auto size = static_cast<std::size_t>(in.read_buf(ALPHABET_SIZE));

    char ch;
    for (std::size_t i = 0; i < size; i++) {
        code.clear();
        ch = in.read_char();
        for (int j = 0; j < full_code_size; j++) {
            code.push_back(static_cast<bool>(in.read_buf(1)));
        }
        std::reverse(code.begin(), code.end());
        code = decode_full_code(code);
        tree.add_code(ch, code);
    }

    used_additional_bytes = BITS_IN_SIZE_T + ALPHABET_SIZE + size * (BITS_IN_BYTE + full_code_size)
                            + BITS_IN_INT;
    used_additional_bytes /= BITS_IN_BYTE;

    bool bit;
    std::pair<bool, char> node;
    tree.back_to_root();
    std::size_t i = 0;
    while (i < num_of_symbols_out) {
        bit = (bool) in.read_buf(1);
        node = tree.walk(bit);
        if (node.first) {
            cout.write(reinterpret_cast<const char *>(&node.second), 1);
            tree.back_to_root();
            i++;
        }
    }
    num_of_symbols_in = static_cast<std::size_t >(cin.tellg()) - used_additional_bytes;
}